

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O3

uint32_t crc32_16bytes_prefetch
                   (void *data,size_t length,uint32_t previousCrc32,size_t prefetchAhead)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  
  uVar5 = ~previousCrc32;
  if (prefetchAhead + 0x40 <= length) {
    do {
      lVar6 = 0;
      do {
        uVar5 = uVar5 ^ *(uint *)((long)data + lVar6);
        uVar1 = *(uint *)((long)data + lVar6 + 0xc);
        uVar2 = *(uint *)((long)data + lVar6 + 8);
        uVar3 = *(uint *)((long)data + lVar6 + 4);
        uVar5 = *(uint *)((long)Crc32Lookup[1] + (ulong)(uVar1 >> 0xe & 0x3fc)) ^
                Crc32Lookup[0][uVar1 >> 0x18] ^ Crc32Lookup[2][uVar1 >> 8 & 0xff] ^
                Crc32Lookup[3][uVar1 & 0xff] ^ Crc32Lookup[4][uVar2 >> 0x18] ^
                *(uint *)((long)Crc32Lookup[5] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
                Crc32Lookup[6][uVar2 >> 8 & 0xff] ^ Crc32Lookup[7][uVar2 & 0xff] ^
                Crc32Lookup[8][uVar3 >> 0x18] ^
                *(uint *)((long)Crc32Lookup[9] + (ulong)(uVar3 >> 0xe & 0x3fc)) ^
                Crc32Lookup[10][uVar3 >> 8 & 0xff] ^ Crc32Lookup[0xb][uVar3 & 0xff] ^
                Crc32Lookup[0xc][uVar5 >> 0x18] ^
                *(uint *)((long)Crc32Lookup[0xd] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
                Crc32Lookup[0xe][uVar5 >> 8 & 0xff] ^ Crc32Lookup[0xf][uVar5 & 0xff];
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x40);
      data = (void *)((long)data + 0x40);
      length = length - 0x40;
    } while (prefetchAhead + 0x40 <= length);
  }
  if (length != 0) {
    sVar4 = 0;
    do {
      uVar5 = uVar5 >> 8 ^ Crc32Lookup[0][(uint)*(byte *)((long)data + sVar4) ^ uVar5 & 0xff];
      sVar4 = sVar4 + 1;
    } while (length != sVar4);
  }
  return ~uVar5;
}

Assistant:

uint32_t crc32_16bytes_prefetch(const void* data, size_t length, uint32_t previousCrc32 = 0, size_t prefetchAhead = 256)
{
  // CRC code is identical to crc32_16bytes (including unrolling), only added prefetching
  // 256 bytes look-ahead seems to be the sweet spot on Core i7 CPUs

  uint32_t crc = ~previousCrc32; // same as previousCrc32 ^ 0xFFFFFFFF
  const uint32_t* current = (const uint32_t*) data;

  // enabling optimization (at least -O2) automatically unrolls the for-loop
  const size_t Unroll = 4;
  const size_t BytesAtOnce = 16 * Unroll;

  while (length >= BytesAtOnce + prefetchAhead)
  {
    PREFETCH(((const char*) current) + prefetchAhead);

    for (size_t unrolling = 0; unrolling < Unroll; unrolling++)
    {
#if __BYTE_ORDER == __BIG_ENDIAN
    uint32_t one   = *current++ ^ swap(crc);
    uint32_t two   = *current++;
    uint32_t three = *current++;
    uint32_t four  = *current++;
    crc  = Crc32Lookup[ 0][ four         & 0xFF] ^
           Crc32Lookup[ 1][(four  >>  8) & 0xFF] ^
           Crc32Lookup[ 2][(four  >> 16) & 0xFF] ^
           Crc32Lookup[ 3][(four  >> 24) & 0xFF] ^
           Crc32Lookup[ 4][ three        & 0xFF] ^
           Crc32Lookup[ 5][(three >>  8) & 0xFF] ^
           Crc32Lookup[ 6][(three >> 16) & 0xFF] ^
           Crc32Lookup[ 7][(three >> 24) & 0xFF] ^
           Crc32Lookup[ 8][ two          & 0xFF] ^
           Crc32Lookup[ 9][(two   >>  8) & 0xFF] ^
           Crc32Lookup[10][(two   >> 16) & 0xFF] ^
           Crc32Lookup[11][(two   >> 24) & 0xFF] ^
           Crc32Lookup[12][ one          & 0xFF] ^
           Crc32Lookup[13][(one   >>  8) & 0xFF] ^
           Crc32Lookup[14][(one   >> 16) & 0xFF] ^
           Crc32Lookup[15][(one   >> 24) & 0xFF];
#else
    uint32_t one   = *current++ ^ crc;
    uint32_t two   = *current++;
    uint32_t three = *current++;
    uint32_t four  = *current++;
    crc  = Crc32Lookup[ 0][(four  >> 24) & 0xFF] ^
           Crc32Lookup[ 1][(four  >> 16) & 0xFF] ^
           Crc32Lookup[ 2][(four  >>  8) & 0xFF] ^
           Crc32Lookup[ 3][ four         & 0xFF] ^
           Crc32Lookup[ 4][(three >> 24) & 0xFF] ^
           Crc32Lookup[ 5][(three >> 16) & 0xFF] ^
           Crc32Lookup[ 6][(three >>  8) & 0xFF] ^
           Crc32Lookup[ 7][ three        & 0xFF] ^
           Crc32Lookup[ 8][(two   >> 24) & 0xFF] ^
           Crc32Lookup[ 9][(two   >> 16) & 0xFF] ^
           Crc32Lookup[10][(two   >>  8) & 0xFF] ^
           Crc32Lookup[11][ two          & 0xFF] ^
           Crc32Lookup[12][(one   >> 24) & 0xFF] ^
           Crc32Lookup[13][(one   >> 16) & 0xFF] ^
           Crc32Lookup[14][(one   >>  8) & 0xFF] ^
           Crc32Lookup[15][ one          & 0xFF];
#endif
    }

    length -= BytesAtOnce;
  }

  const uint8_t* currentChar = (const uint8_t*) current;
  // remaining 1 to 63 bytes (standard algorithm)
  while (length-- != 0)
    crc = (crc >> 8) ^ Crc32Lookup[0][(crc & 0xFF) ^ *currentChar++];

  return ~crc; // same as crc ^ 0xFFFFFFFF
}